

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O0

void __thiscall embree::XMLWriter::store(XMLWriter *this,char *name,Vec3fa *v)

{
  ostream *poVar1;
  float *in_RDX;
  char *in_RSI;
  XMLWriter *in_RDI;
  
  tab(in_RDI);
  poVar1 = std::operator<<((ostream *)&in_RDI->field_0x10,"<");
  poVar1 = std::operator<<(poVar1,in_RSI);
  poVar1 = std::operator<<(poVar1,">");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*in_RDX);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RDX[1]);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RDX[2]);
  poVar1 = std::operator<<(poVar1,"</");
  poVar1 = std::operator<<(poVar1,in_RSI);
  poVar1 = std::operator<<(poVar1,">");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void XMLWriter::store(const char* name, const Vec3fa& v) {
    tab(); xml << "<" << name << ">" << v.x << " " << v.y << " " << v.z << "</" << name << ">" << std::endl;
  }